

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O1

bool DecodeBase58(string *str,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet,
                 int max_ret_len)

{
  char *pcVar1;
  char *psz;
  size_type sVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  psz = (str->_M_dataplus)._M_p;
  bVar3 = str->_M_string_length == 0;
  if ((!bVar3) && (*psz != '\0')) {
    sVar2 = 1;
    do {
      bVar3 = str->_M_string_length == sVar2;
      if (bVar3) break;
      pcVar1 = psz + sVar2;
      sVar2 = sVar2 + 1;
    } while (*pcVar1 != '\0');
  }
  if (bVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      bVar3 = DecodeBase58(psz,vchRet,max_ret_len);
      return bVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeBase58(const std::string& str, std::vector<unsigned char>& vchRet, int max_ret_len)
{
    if (!ContainsNoNUL(str)) {
        return false;
    }
    return DecodeBase58(str.c_str(), vchRet, max_ret_len);
}